

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

value_type * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
CreateValueTypeInternal
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,MapKey *key)

{
  value_type *this_00;
  
  if (this->arena_ == (Arena *)0x0) {
    this_00 = (value_type *)operator_new(0x20);
    MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapPair(this_00,key);
  }
  else {
    this_00 = (value_type *)
              Arena::AllocateAligned(this->arena_,(type_info *)&unsigned_char::typeinfo,0x20);
    Arena::CreateInArenaStorage<google::protobuf::MapKey>((MapKey *)this_00,this->arena_);
    Arena::CreateInArenaStorage<google::protobuf::MapValueRef>(&this_00->second,this->arena_);
    (&(this_00->first).val_)[1].int32_value_ = key->type_;
    (this_00->first).val_ = key->val_;
  }
  return this_00;
}

Assistant:

value_type* CreateValueTypeInternal(const Key& key) {
    if (arena_ == NULL) {
      return new value_type(key);
    } else {
      value_type* value = reinterpret_cast<value_type*>(
          Arena::CreateArray<uint8>(arena_, sizeof(value_type)));
      Arena::CreateInArenaStorage(const_cast<Key*>(&value->first), arena_);
      Arena::CreateInArenaStorage(&value->second, arena_);
      const_cast<Key&>(value->first) = key;
      return value;
    }
  }